

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O0

void asio::aligned_delete(void *ptr)

{
  void *in_RDI;
  
  free(in_RDI);
  return;
}

Assistant:

inline void aligned_delete(void* ptr)
{
#if defined(ASIO_HAS_STD_ALIGNED_ALLOC) && defined(ASIO_HAS_ALIGNOF)
  std::free(ptr);
#elif defined(ASIO_HAS_BOOST_ALIGN) && defined(ASIO_HAS_ALIGNOF)
  boost::alignment::aligned_free(ptr);
#elif defined(ASIO_MSVC) && defined(ASIO_HAS_ALIGNOF)
  _aligned_free(ptr);
#else // defined(ASIO_MSVC) && defined(ASIO_HAS_ALIGNOF)
  ::operator delete(ptr);
#endif // defined(ASIO_MSVC) && defined(ASIO_HAS_ALIGNOF)
}